

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int whereKeyStats(Parse *pParse,Index *pIdx,UnpackedRecord *pRec,int roundUp,tRowcnt *aStat)

{
  long lVar1;
  long lVar2;
  long lVar3;
  undefined8 *puVar4;
  ushort uVar5;
  short sVar6;
  ulong uVar7;
  long lVar8;
  char cVar9;
  int iVar10;
  undefined4 in_register_0000000c;
  int *piVar11;
  int *piVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  ushort uVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  int local_6c;
  uint local_68;
  
  piVar11 = (int *)CONCAT44(in_register_0000000c,roundUp);
  lVar15 = *(long *)&pParse->regRowid;
  uVar5 = *(ushort *)&pIdx->aiRowLogEst;
  uVar17 = (uint)uVar5;
  iVar16 = (pParse->constraintName).n * uVar17;
  iVar21 = 0;
  local_68 = 0;
  local_6c = 0;
  do {
    iVar10 = iVar16 + iVar21;
    iVar20 = iVar10 / 2;
    lVar14 = CONCAT44(iVar10 - (iVar10 >> 0x1f) >> 0x1f,iVar20);
    uVar7 = lVar14 / (long)(int)uVar17;
    iVar10 = (int)uVar7;
    uVar18 = (uint)uVar5;
    if (iVar10 < 1) {
      uVar22 = iVar20 + 1;
    }
    else {
      lVar8 = (uVar7 & 0xffffffff) * 0x28;
      iVar13 = (int)(lVar14 % (long)(int)uVar17);
      lVar14 = (long)iVar13;
      uVar22 = iVar13 + 1U;
      if ((int)(iVar13 + 1U) <= (int)uVar18) {
        uVar22 = uVar18;
      }
      do {
        lVar1 = lVar14 + 1;
        if ((long)(ulong)uVar5 <= lVar1) goto LAB_001885b6;
        lVar2 = lVar14 * 4;
        lVar3 = lVar14 * 4;
        lVar14 = lVar1;
      } while (*(int *)(*(long *)(lVar15 + -0x10 + lVar8) + lVar2) ==
               *(int *)(*(long *)(lVar8 + lVar15 + 0x18) + lVar3));
      uVar22 = (uint)lVar1;
    }
LAB_001885b6:
    *(short *)&pIdx->aiRowLogEst = (short)uVar22;
    puVar4 = (undefined8 *)(lVar15 + (long)iVar10 * 0x28);
    iVar10 = sqlite3VdbeRecordCompareWithSkip
                       (*(int *)(puVar4 + 1),(void *)*puVar4,(UnpackedRecord *)pIdx,0);
    if (iVar10 < 0) {
      local_68 = *(int *)(puVar4[2] + -4 + (long)(int)uVar22 * 4) +
                 *(int *)(puVar4[3] + -4 + (long)(int)uVar22 * 4);
LAB_0018860b:
      iVar21 = iVar20 + 1;
      iVar10 = -1;
    }
    else {
      if ((iVar10 == 0) && ((int)uVar22 < (int)uVar18)) {
        local_68 = *(uint *)(puVar4[3] + -4 + (long)(int)uVar22 * 4);
        goto LAB_0018860b;
      }
      local_6c = uVar22 - 1;
      iVar16 = iVar20;
    }
    if ((iVar10 == 0) || (iVar16 <= iVar21)) {
      iVar16 = iVar16 / (int)uVar18;
      if (iVar10 == 0) {
        *piVar11 = *(int *)(*(long *)(lVar15 + 0x18 + (long)iVar16 * 0x28) + (long)local_6c * 4);
        piVar12 = (int *)((long)local_6c * 4 + *(long *)(lVar15 + 0x10 + (long)iVar16 * 0x28));
      }
      else {
        if (iVar16 < (int)(pParse->constraintName).n) {
          uVar17 = *(uint *)(*(long *)(lVar15 + 0x18 + (long)iVar16 * 0x28) + (long)local_6c * 4);
        }
        else {
          sVar6 = *(short *)&pParse->pVdbe->db;
          iVar21 = (int)sVar6 / 10;
          uVar19 = sVar6 + (short)iVar21 * -10;
          lVar15 = 0;
          if (uVar19 != 0) {
            lVar15 = (long)(short)uVar19 + -1;
          }
          if (4 < uVar19) {
            lVar15 = (long)(short)uVar19 + -2;
          }
          cVar9 = (char)iVar21;
          uVar17 = (uint)(lVar15 + 8U >> (3U - cVar9 & 0x3f));
          if (0x1d < sVar6) {
            uVar17 = (uint)(lVar15 + 8U << (cVar9 - 3U & 0x3f));
          }
        }
        iVar21 = uVar17 - local_68;
        if (uVar17 < local_68) {
          iVar21 = 0;
        }
        *piVar11 = (uint)(iVar21 << ((int)pRec != 0)) / 3 + local_68;
        piVar12 = (int *)(*(long *)&pParse->writeMask + (ulong)uVar5 * 4 + -4);
      }
      piVar11[1] = *piVar12;
      *(ushort *)&pIdx->aiRowLogEst = uVar5;
      return iVar16;
    }
  } while( true );
}

Assistant:

static int whereKeyStats(
  Parse *pParse,              /* Database connection */
  Index *pIdx,                /* Index to consider domain of */
  UnpackedRecord *pRec,       /* Vector of values to consider */
  int roundUp,                /* Round up if true.  Round down if false */
  tRowcnt *aStat              /* OUT: stats written here */
){
  IndexSample *aSample = pIdx->aSample;
  int iCol;                   /* Index of required stats in anEq[] etc. */
  int i;                      /* Index of first sample >= pRec */
  int iSample;                /* Smallest sample larger than or equal to pRec */
  int iMin = 0;               /* Smallest sample not yet tested */
  int iTest;                  /* Next sample to test */
  int res;                    /* Result of comparison operation */
  int nField;                 /* Number of fields in pRec */
  tRowcnt iLower = 0;         /* anLt[] + anEq[] of largest sample pRec is > */

#ifndef SQLITE_DEBUG
  UNUSED_PARAMETER( pParse );
#endif
  assert( pRec!=0 );
  assert( pIdx->nSample>0 );
  assert( pRec->nField>0 && pRec->nField<=pIdx->nSampleCol );

  /* Do a binary search to find the first sample greater than or equal
  ** to pRec. If pRec contains a single field, the set of samples to search
  ** is simply the aSample[] array. If the samples in aSample[] contain more
  ** than one fields, all fields following the first are ignored.
  **
  ** If pRec contains N fields, where N is more than one, then as well as the
  ** samples in aSample[] (truncated to N fields), the search also has to
  ** consider prefixes of those samples. For example, if the set of samples
  ** in aSample is:
  **
  **     aSample[0] = (a, 5) 
  **     aSample[1] = (a, 10) 
  **     aSample[2] = (b, 5) 
  **     aSample[3] = (c, 100) 
  **     aSample[4] = (c, 105)
  **
  ** Then the search space should ideally be the samples above and the 
  ** unique prefixes [a], [b] and [c]. But since that is hard to organize, 
  ** the code actually searches this set:
  **
  **     0: (a) 
  **     1: (a, 5) 
  **     2: (a, 10) 
  **     3: (a, 10) 
  **     4: (b) 
  **     5: (b, 5) 
  **     6: (c) 
  **     7: (c, 100) 
  **     8: (c, 105)
  **     9: (c, 105)
  **
  ** For each sample in the aSample[] array, N samples are present in the
  ** effective sample array. In the above, samples 0 and 1 are based on 
  ** sample aSample[0]. Samples 2 and 3 on aSample[1] etc.
  **
  ** Often, sample i of each block of N effective samples has (i+1) fields.
  ** Except, each sample may be extended to ensure that it is greater than or
  ** equal to the previous sample in the array. For example, in the above, 
  ** sample 2 is the first sample of a block of N samples, so at first it 
  ** appears that it should be 1 field in size. However, that would make it 
  ** smaller than sample 1, so the binary search would not work. As a result, 
  ** it is extended to two fields. The duplicates that this creates do not 
  ** cause any problems.
  */
  nField = pRec->nField;
  iCol = 0;
  iSample = pIdx->nSample * nField;
  do{
    int iSamp;                    /* Index in aSample[] of test sample */
    int n;                        /* Number of fields in test sample */

    iTest = (iMin+iSample)/2;
    iSamp = iTest / nField;
    if( iSamp>0 ){
      /* The proposed effective sample is a prefix of sample aSample[iSamp].
      ** Specifically, the shortest prefix of at least (1 + iTest%nField) 
      ** fields that is greater than the previous effective sample.  */
      for(n=(iTest % nField) + 1; n<nField; n++){
        if( aSample[iSamp-1].anLt[n-1]!=aSample[iSamp].anLt[n-1] ) break;
      }
    }else{
      n = iTest + 1;
    }

    pRec->nField = n;
    res = sqlite3VdbeRecordCompare(aSample[iSamp].n, aSample[iSamp].p, pRec);
    if( res<0 ){
      iLower = aSample[iSamp].anLt[n-1] + aSample[iSamp].anEq[n-1];
      iMin = iTest+1;
    }else if( res==0 && n<nField ){
      iLower = aSample[iSamp].anLt[n-1];
      iMin = iTest+1;
      res = -1;
    }else{
      iSample = iTest;
      iCol = n-1;
    }
  }while( res && iMin<iSample );
  i = iSample / nField;

#ifdef SQLITE_DEBUG
  /* The following assert statements check that the binary search code
  ** above found the right answer. This block serves no purpose other
  ** than to invoke the asserts.  */
  if( pParse->db->mallocFailed==0 ){
    if( res==0 ){
      /* If (res==0) is true, then pRec must be equal to sample i. */
      assert( i<pIdx->nSample );
      assert( iCol==nField-1 );
      pRec->nField = nField;
      assert( 0==sqlite3VdbeRecordCompare(aSample[i].n, aSample[i].p, pRec) 
           || pParse->db->mallocFailed 
      );
    }else{
      /* Unless i==pIdx->nSample, indicating that pRec is larger than
      ** all samples in the aSample[] array, pRec must be smaller than the
      ** (iCol+1) field prefix of sample i.  */
      assert( i<=pIdx->nSample && i>=0 );
      pRec->nField = iCol+1;
      assert( i==pIdx->nSample 
           || sqlite3VdbeRecordCompare(aSample[i].n, aSample[i].p, pRec)>0
           || pParse->db->mallocFailed );

      /* if i==0 and iCol==0, then record pRec is smaller than all samples
      ** in the aSample[] array. Otherwise, if (iCol>0) then pRec must
      ** be greater than or equal to the (iCol) field prefix of sample i.
      ** If (i>0), then pRec must also be greater than sample (i-1).  */
      if( iCol>0 ){
        pRec->nField = iCol;
        assert( sqlite3VdbeRecordCompare(aSample[i].n, aSample[i].p, pRec)<=0
             || pParse->db->mallocFailed );
      }
      if( i>0 ){
        pRec->nField = nField;
        assert( sqlite3VdbeRecordCompare(aSample[i-1].n, aSample[i-1].p, pRec)<0
             || pParse->db->mallocFailed );
      }
    }
  }
#endif /* ifdef SQLITE_DEBUG */

  if( res==0 ){
    /* Record pRec is equal to sample i */
    assert( iCol==nField-1 );
    aStat[0] = aSample[i].anLt[iCol];
    aStat[1] = aSample[i].anEq[iCol];
  }else{
    /* At this point, the (iCol+1) field prefix of aSample[i] is the first 
    ** sample that is greater than pRec. Or, if i==pIdx->nSample then pRec
    ** is larger than all samples in the array. */
    tRowcnt iUpper, iGap;
    if( i>=pIdx->nSample ){
      iUpper = sqlite3LogEstToInt(pIdx->aiRowLogEst[0]);
    }else{
      iUpper = aSample[i].anLt[iCol];
    }

    if( iLower>=iUpper ){
      iGap = 0;
    }else{
      iGap = iUpper - iLower;
    }
    if( roundUp ){
      iGap = (iGap*2)/3;
    }else{
      iGap = iGap/3;
    }
    aStat[0] = iLower + iGap;
    aStat[1] = pIdx->aAvgEq[nField-1];
  }

  /* Restore the pRec->nField value before returning.  */
  pRec->nField = nField;
  return i;
}